

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

Am_Object get_objgen_window(void)

{
  Am_Slot_Key key;
  Am_Object_Data *in_RDI;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38 [3];
  Am_Object local_20;
  undefined1 local_11;
  Am_Object *w;
  
  local_11 = 0;
  am_get_db_from_list((Am_Object *)in_RDI,(Am_Value_List *)&am_objgen,(int *)&objgen_windows);
  key = (Am_Slot_Key)in_RDI;
  Am_Object::Get_Object(&local_20,key,(ulong)Am_CONSTANT_OBJECTS_WIDGET);
  Am_Object::Set(&local_20,0x169,"",0);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Get_Object(local_38,key,(ulong)Am_INDEXES_OF_COMMANDS_WIDGET);
  Am_Object::Set(local_38,0x169,"",0);
  Am_Object::~Am_Object(local_38);
  Am_Object::Get_Object(&local_40,key,(ulong)Am_SOME_OBJECTS_WIDGET);
  Am_Object::Set(&local_40,0x169,"",0);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Get_Object(&local_48,key,(ulong)Am_ALL_FROM_COMMAND_WIDGET);
  Am_Object::Set(&local_48,0x169,"",0);
  Am_Object::~Am_Object(&local_48);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object
get_objgen_window()
{
  Am_Object w =
      am_get_db_from_list(am_objgen, objgen_windows, num_vis_objgen_windows);
  w.Get_Object(Am_CONSTANT_OBJECTS_WIDGET).Set(Am_VALUE, "");
  w.Get_Object(Am_INDEXES_OF_COMMANDS_WIDGET).Set(Am_VALUE, "");
  w.Get_Object(Am_SOME_OBJECTS_WIDGET).Set(Am_VALUE, "");
  w.Get_Object(Am_ALL_FROM_COMMAND_WIDGET).Set(Am_VALUE, "");

  return w;
}